

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

bool __thiscall
despot::Chain::Step(Chain *this,State *s,double random_num,ACT_TYPE action,double *reward,
                   OBS_TYPE *obs)

{
  int s2;
  double dVar1;
  vector<double,_std::allocator<double>_> local_60;
  int local_44;
  State *pSStack_40;
  int next;
  ChainState *state;
  OBS_TYPE *obs_local;
  double *reward_local;
  double dStack_20;
  ACT_TYPE action_local;
  double random_num_local;
  State *s_local;
  Chain *this_local;
  
  pSStack_40 = s;
  state = (ChainState *)obs;
  obs_local = (OBS_TYPE *)reward;
  reward_local._4_4_ = action;
  dStack_20 = random_num;
  random_num_local = (double)s;
  s_local = (State *)this;
  ChainState::GetTransition(&local_60,(ChainState *)s,*(int *)(s + 0x38),action);
  s2 = despot::Random::GetCategory((vector *)&local_60,dStack_20);
  std::vector<double,_std::allocator<double>_>::~vector(&local_60);
  local_44 = s2;
  dVar1 = Reward(this,*(int *)(pSStack_40 + 0x38),reward_local._4_4_,s2);
  *obs_local = (OBS_TYPE)dVar1;
  *(int *)(pSStack_40 + 0x38) = local_44;
  *(long *)state = (long)*(int *)(pSStack_40 + 0x38);
  return false;
}

Assistant:

bool Chain::Step(State& s, double random_num, ACT_TYPE action, double &reward,
	OBS_TYPE &obs) const {
	ChainState& state = static_cast<ChainState&>(s);
	int next = Random::GetCategory(state.GetTransition(state.mdp_state, action),
		random_num);
	reward = Reward(state.mdp_state, action, next);
	state.mdp_state = next;
	obs = state.mdp_state;

	return false;
}